

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ExpListNode * __thiscall Parser::ExprList(Parser *this)

{
  uint uVar1;
  ExpListNode *this_00;
  ExpNode *exp;
  ExpListNode *next;
  
  if (((ulong)(uint)this->tok < 0x39) &&
     ((0x1c03047c0004400U >> ((ulong)(uint)this->tok & 0x3f) & 1) != 0)) {
    uVar1 = this->tok;
    if (((ulong)uVar1 < 0x39) && ((0x1c03047c0004400U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
      this_00 = (ExpListNode *)operator_new(0x20);
      exp = ExprAssign(this);
      next = ExprListTailAUX(this);
      ExpListNode::ExpListNode(this_00,exp,next);
      uVar1 = lexical_analyzer_getLine();
      (*(this_00->super_ASTNode)._vptr_ASTNode[2])(this_00,(ulong)uVar1);
    }
    else {
      Sync(this,uVar1,exprListTailFollowSet);
      this_00 = (ExpListNode *)0x0;
    }
    return this_00;
  }
  return (ExpListNode *)0x0;
}

Assistant:

ExpListNode *Parser::ExprList() {
    switch (tok) {
        case NOT:
        case PLUS:
        case MINUS:
        case STAR:
        case ADDRESS:
        case ID:
        case NUMINT:
        case NUMFLOAT:
        case LITERAL:
        case LITERALCHAR:
        case TRUE:
        case FALSE:
        case LPARENT: {
            return ExprListTail();
        }
        default: {
            return nullptr;
        }
    }
}